

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5.cc
# Opt level: O3

void __thiscall
trng::mrg5::seed(mrg5 *this,result_type s1,result_type s2,result_type s3,result_type s4,
                result_type s5)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  
  auVar5._4_4_ = s2;
  auVar5._0_4_ = s2;
  auVar5._8_4_ = s4;
  auVar5._12_4_ = s4;
  iVar1 = (int)((ulong)(uint)s1 * 0x40000001 >> 0x20) - (-(uint)(s1 < 0) & 0x40000001);
  iVar2 = (int)((ulong)(uint)s2 * 0x40000001 >> 0x20) - (-(uint)(s2 < 0) & 0x40000001);
  iVar3 = (int)((ulong)(uint)s3 * 0x40000001 >> 0x20) - (-(uint)(s3 < 0) & 0x40000001);
  iVar4 = (int)((auVar5._8_8_ & 0xffffffff) * 0x40000001 >> 0x20) - (-(uint)(s4 < 0) & 0x40000001);
  iVar1 = s1 + ((iVar1 >> 0x1d) - (iVar1 >> 0x1f)) * -0x7fffffff;
  iVar2 = s2 + ((iVar2 >> 0x1d) - (iVar2 >> 0x1f)) * -0x7fffffff;
  iVar3 = s3 + ((iVar3 >> 0x1d) - (iVar3 >> 0x1f)) * -0x7fffffff;
  iVar4 = s4 + ((iVar4 >> 0x1d) - (iVar4 >> 0x1f)) * -0x7fffffff;
  (this->S).r[0] = (-(uint)(iVar1 < 0) >> 1) + iVar1;
  (this->S).r[1] = (-(uint)(iVar2 < 0) >> 1) + iVar2;
  (this->S).r[2] = (-(uint)(iVar3 < 0) >> 1) + iVar3;
  (this->S).r[3] = (-(uint)(iVar4 < 0) >> 1) + iVar4;
  iVar1 = ((int)((long)s5 * 0x40000001 >> 0x3d) - (s5 >> 0x1f)) * -0x7fffffff;
  iVar2 = s5 + iVar1;
  iVar1 = s5 + iVar1 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  (this->S).r[4] = iVar1;
  return;
}

Assistant:

void mrg5::seed(mrg5::result_type s1, mrg5::result_type s2, mrg5::result_type s3,
                  mrg5::result_type s4, mrg5::result_type s5) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
    S.r[2] = s3 % modulus;
    if (S.r[2] < 0)
      S.r[2] += modulus;
    S.r[3] = s4 % modulus;
    if (S.r[3] < 0)
      S.r[3] += modulus;
    S.r[4] = s5 % modulus;
    if (S.r[4] < 0)
      S.r[4] += modulus;
  }